

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

void __thiscall tvm::runtime::TVMRetValue::Clear(TVMRetValue *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  PackedFunc *this_01;
  TVMRetValue *this_local;
  
  if ((this->super_TVMPODValue_).type_code_ != 4) {
    switch((this->super_TVMPODValue_).type_code_) {
    case 8:
      Object::DecRef((Object *)(this->super_TVMPODValue_).value_.v_handle);
      break;
    case 9:
      Object::DecRef((Object *)(this->super_TVMPODValue_).value_.v_handle);
      break;
    case 10:
      this_01 = TVMPODValue_::ptr<tvm::runtime::PackedFunc>(&this->super_TVMPODValue_);
      if (this_01 != (PackedFunc *)0x0) {
        PackedFunc::~PackedFunc(this_01);
        operator_delete(this_01);
      }
      break;
    case 0xb:
    case 0xc:
      this_00 = TVMPODValue_::ptr<std::__cxx11::string>(&this->super_TVMPODValue_);
      if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::__cxx11::string::~string((string *)this_00);
        operator_delete(this_00);
      }
      break;
    case 0xd:
      NDArray::FFIDecRef((TVMArrayHandle)(this->super_TVMPODValue_).value_.v_handle);
    }
    (this->super_TVMPODValue_).type_code_ = 4;
  }
  return;
}

Assistant:

void Clear() {
    if (type_code_ == kTVMNullptr) return;
    switch (type_code_) {
      case kTVMStr: case kTVMBytes: delete ptr<std::string>(); break;
      case kTVMPackedFuncHandle: delete ptr<PackedFunc>(); break;
      case kTVMNDArrayHandle: {
        NDArray::FFIDecRef(static_cast<TVMArrayHandle>(value_.v_handle));
        break;
      }
      case kTVMModuleHandle: {
        static_cast<Object*>(value_.v_handle)->DecRef();
        break;
      }
      case kTVMObjectHandle: {
        static_cast<Object*>(value_.v_handle)->DecRef();
        break;
      }
    }
    type_code_ = kTVMNullptr;
  }